

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

int fetch_escaped_value_raw(OnigUChar **src,OnigUChar *end,ParseEnv *env,OnigCodePoint *val)

{
  int iVar1;
  ParseEnv *local_48;
  OnigUChar *p;
  OnigEncoding enc;
  OnigCodePoint c;
  int v;
  OnigCodePoint *val_local;
  ParseEnv *env_local;
  OnigUChar *end_local;
  OnigUChar **src_local;
  
  p = (OnigUChar *)env->enc;
  local_48 = (ParseEnv *)*src;
  if (end <= local_48) {
    return -0x68;
  }
  _c = val;
  val_local = &env->options;
  env_local = (ParseEnv *)end;
  end_local = (OnigUChar *)src;
  enc._0_4_ = (*((OnigEncoding)p)->mbc_to_code)((OnigUChar *)local_48,end);
  iVar1 = (**(code **)p)(local_48);
  local_48 = (ParseEnv *)
             ((long)&((ParseEnv *)(local_48->mem_env_static + -6))->options + (long)iVar1);
  if ((uint)enc == 0x43) {
    if ((*(uint *)(*(long *)(val_local + 4) + 4) & 0x800) != 0) {
      if (env_local <= local_48) {
        return -0x6a;
      }
      enc._0_4_ = (**(code **)(p + 0x20))(local_48,env_local);
      iVar1 = (**(code **)p)(local_48);
      local_48 = (ParseEnv *)
                 ((long)&((ParseEnv *)(local_48->mem_env_static + -6))->options + (long)iVar1);
      if ((uint)enc != 0x2d) {
        return -0x6d;
      }
LAB_001175bd:
      if (env_local <= local_48) {
        return -0x6a;
      }
      enc._0_4_ = (**(code **)(p + 0x20))(local_48,env_local);
      iVar1 = (**(code **)p)(local_48);
      local_48 = (ParseEnv *)
                 ((long)&((ParseEnv *)(local_48->mem_env_static + -6))->options + (long)iVar1);
      if ((uint)enc == 0x3f) {
        enc._0_4_ = 0x7f;
      }
      else {
        if (((uint)enc == *(uint *)(*(long *)(val_local + 4) + 0x10)) &&
           (iVar1 = fetch_escaped_value_raw
                              ((OnigUChar **)&local_48,(OnigUChar *)env_local,(ParseEnv *)val_local,
                               (OnigCodePoint *)&enc), iVar1 < 0)) {
          return iVar1;
        }
        enc._0_4_ = (uint)enc & 0x9f;
      }
      goto LAB_0011767e;
    }
  }
  else if ((uint)enc == 0x4d) {
    if ((*(uint *)(*(long *)(val_local + 4) + 4) & 0x1000) != 0) {
      if (env_local <= local_48) {
        return -0x69;
      }
      enc._0_4_ = (**(code **)(p + 0x20))(local_48,env_local);
      iVar1 = (**(code **)p)(local_48);
      local_48 = (ParseEnv *)
                 ((long)&((ParseEnv *)(local_48->mem_env_static + -6))->options + (long)iVar1);
      if ((uint)enc != 0x2d) {
        return -0x6c;
      }
      if (env_local <= local_48) {
        return -0x69;
      }
      enc._0_4_ = (**(code **)(p + 0x20))(local_48,env_local);
      iVar1 = (**(code **)p)(local_48);
      local_48 = (ParseEnv *)
                 ((long)&((ParseEnv *)(local_48->mem_env_static + -6))->options + (long)iVar1);
      if (((uint)enc == *(uint *)(*(long *)(val_local + 4) + 0x10)) &&
         (iVar1 = fetch_escaped_value_raw
                            ((OnigUChar **)&local_48,(OnigUChar *)env_local,(ParseEnv *)val_local,
                             (OnigCodePoint *)&enc), iVar1 < 0)) {
        return iVar1;
      }
      enc._0_4_ = (uint)enc & 0xff | 0x80;
      goto LAB_0011767e;
    }
  }
  else if (((uint)enc == 99) && ((**(uint **)(val_local + 4) & 0x8000000) != 0)) goto LAB_001175bd;
  enc._0_4_ = conv_backslash_value((uint)enc,(ParseEnv *)val_local);
LAB_0011767e:
  *(ParseEnv **)end_local = local_48;
  *_c = (uint)enc;
  return 0;
}

Assistant:

static int
fetch_escaped_value_raw(UChar** src, UChar* end, ParseEnv* env,
                        OnigCodePoint* val)
{
  int v;
  OnigCodePoint c;
  OnigEncoding enc = env->enc;
  UChar* p = *src;

  if (PEND) return ONIGERR_END_PATTERN_AT_ESCAPE;

  PFETCH_S(c);
  switch (c) {
  case 'M':
    if (IS_SYNTAX_OP2(env->syntax, ONIG_SYN_OP2_ESC_CAPITAL_M_BAR_META)) {
      if (PEND) return ONIGERR_END_PATTERN_AT_META;
      PFETCH_S(c);
      if (c != '-') return ONIGERR_META_CODE_SYNTAX;
      if (PEND) return ONIGERR_END_PATTERN_AT_META;
      PFETCH_S(c);
      if (c == MC_ESC(env->syntax)) {
        v = fetch_escaped_value_raw(&p, end, env, &c);
        if (v < 0) return v;
      }
      c = ((c & 0xff) | 0x80);
    }
    else
      goto backslash;
    break;

  case 'C':
    if (IS_SYNTAX_OP2(env->syntax, ONIG_SYN_OP2_ESC_CAPITAL_C_BAR_CONTROL)) {
      if (PEND) return ONIGERR_END_PATTERN_AT_CONTROL;
      PFETCH_S(c);
      if (c != '-') return ONIGERR_CONTROL_CODE_SYNTAX;
      goto control;
    }
    else
      goto backslash;

  case 'c':
    if (IS_SYNTAX_OP(env->syntax, ONIG_SYN_OP_ESC_C_CONTROL)) {
    control:
      if (PEND) return ONIGERR_END_PATTERN_AT_CONTROL;
      PFETCH_S(c);
      if (c == '?') {
        c = 0177;
      }
      else {
        if (c == MC_ESC(env->syntax)) {
          v = fetch_escaped_value_raw(&p, end, env, &c);
          if (v < 0) return v;
        }
        c &= 0x9f;
      }
      break;
    }
    /* fall through */

  default:
    {
    backslash:
      c = conv_backslash_value(c, env);
    }
    break;
  }

  *src = p;
  *val = c;
  return 0;
}